

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

void av1_update_temporal_layer_framerate(AV1_COMP *cpi)

{
  int iVar1;
  LAYER_CONTEXT *pLVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pLVar2 = (cpi->svc).layer_context;
  iVar1 = (cpi->svc).temporal_layer_id;
  lVar5 = (long)((cpi->svc).number_temporal_layers * (cpi->svc).spatial_layer_id + iVar1);
  dVar8 = cpi->framerate;
  dVar7 = dVar8 / (double)pLVar2[lVar5].framerate_factor;
  pLVar2[lVar5].framerate = dVar7;
  lVar3 = pLVar2[lVar5].target_bandwidth;
  dVar6 = round((double)lVar3 / dVar7);
  iVar4 = (int)dVar6;
  pLVar2[lVar5].rc.avg_frame_bandwidth = iVar4;
  pLVar2[lVar5].rc.max_frame_bandwidth = (cpi->rc).max_frame_bandwidth;
  if (iVar1 != 0) {
    dVar8 = dVar8 / (double)pLVar2[lVar5 + -1].framerate_factor;
    if (dVar8 < dVar7) {
      dVar8 = round((double)(lVar3 - pLVar2[lVar5 + -1].layer_target_bitrate) / (dVar7 - dVar8));
      iVar4 = (int)dVar8;
    }
  }
  pLVar2[lVar5].avg_frame_size = iVar4;
  return;
}

Assistant:

void av1_update_temporal_layer_framerate(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  LAYER_CONTEXT *const lc = get_layer_context(cpi);
  RATE_CONTROL *const lrc = &lc->rc;
  const int tl = svc->temporal_layer_id;
  lc->framerate = cpi->framerate / lc->framerate_factor;
  lrc->avg_frame_bandwidth = (int)round(lc->target_bandwidth / lc->framerate);
  lrc->max_frame_bandwidth = cpi->rc.max_frame_bandwidth;
  // Update the average layer frame size (non-cumulative per-frame-bw).
  if (tl == 0) {
    lc->avg_frame_size = lrc->avg_frame_bandwidth;
  } else {
    int prev_layer = svc->spatial_layer_id * svc->number_temporal_layers +
                     svc->temporal_layer_id - 1;
    LAYER_CONTEXT *const lcprev = &svc->layer_context[prev_layer];
    const double prev_layer_framerate =
        cpi->framerate / lcprev->framerate_factor;
    const int64_t prev_layer_target_bandwidth = lcprev->layer_target_bitrate;
    if (lc->framerate > prev_layer_framerate) {
      lc->avg_frame_size =
          (int)round((lc->target_bandwidth - prev_layer_target_bandwidth) /
                     (lc->framerate - prev_layer_framerate));
    } else {
      lc->avg_frame_size = (int)round(lc->target_bandwidth / lc->framerate);
    }
  }
}